

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

void __thiscall
boost::shared_ptr<boost::exception_detail::clone_base_const>::
shared_ptr<boost::exception_detail::clone_impl<boost::exception_detail::bad_alloc_>>
          (shared_ptr<const_boost::exception_detail::clone_base> *this,
          clone_impl<boost::exception_detail::bad_alloc_> *p)

{
  shared_count *in_RSI;
  long *in_RDI;
  clone_impl<boost::exception_detail::bad_alloc_> *p_00;
  shared_ptr<const_boost::exception_detail::clone_base> *in_stack_ffffffffffffffe0;
  
  p_00 = (clone_impl<boost::exception_detail::bad_alloc_> *)0x0;
  if (in_RSI != (shared_count *)0x0) {
    p_00 = (clone_impl<boost::exception_detail::bad_alloc_> *)
           ((long)&in_RSI->pi_ + *(long *)&in_RSI->pi_[-2].use_count_);
  }
  *in_RDI = (long)p_00;
  detail::shared_count::shared_count((shared_count *)(in_RDI + 1));
  detail::
  sp_pointer_construct<boost::exception_detail::clone_base_const,boost::exception_detail::clone_impl<boost::exception_detail::bad_alloc_>>
            (in_stack_ffffffffffffffe0,p_00,in_RSI);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }